

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::TypeSpecializeInlineBuiltInUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef)

{
  Opnd *opnd;
  code *pcVar1;
  bool bVar2;
  BuiltinFunction index;
  OpndKind OVar3;
  BuiltInFlags BVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  char *message;
  Value *pVVar7;
  OpCode originalOpCode;
  char *error;
  uint lineNumber;
  uint uVar8;
  Instr *pIVar9;
  GlobOpt *this_00;
  uint uVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  uint local_44;
  Value *pVStack_40;
  int maxVal;
  uint local_34 [2];
  int minVal;
  
  pVStack_40 = src1OriginalVal;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1def,"(pSrc1Val)","pSrc1Val");
    if (!bVar2) goto LAB_0045d31a;
    *puVar5 = 0;
  }
  bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df2,"(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))",
                       "OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)");
    if (!bVar2) goto LAB_0045d31a;
    *puVar5 = 0;
  }
  index = Js::JavascriptLibrary::GetBuiltInInlineCandidateId((*pInstr)->m_opcode);
  if (index._value == 'H') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df5,"(builtInId != Js::BuiltinFunction::None)",
                       "builtInId != Js::BuiltinFunction::None");
    if (!bVar2) goto LAB_0045d31a;
    *puVar5 = 0;
  }
  BVar4 = Js::JavascriptLibrary::GetFlagsForBuiltIn(index);
  if ((BVar4 & BIF_Args) == BIF_TypeSpecUnaryToFloat) {
    if ((this->field_0xf5 & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e00,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    *pSrc1Val = pVStack_40;
    bVar2 = TypeSpecializeFloatUnary(this,pInstr,pVStack_40,pDstVal,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e05,"(retVal)",
                         "For inline built-ins the args have to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,*pSrc1Val,(Value *)0x0,pDstVal);
    return;
  }
  pIVar9 = *pInstr;
  switch(pIVar9->m_opcode) {
  case InlineMathAbs:
    bVar2 = ValueInfo::GetIntValMinMax((*pSrc1Val)->valueInfo,(int *)local_34,(int *)&local_44,true)
    ;
    if (!bVar2) {
      if ((*(uint *)&this->field_0xf4 >> 0xd & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2a,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
        if (!bVar2) goto LAB_0045d31a;
        *puVar5 = 0;
      }
      *pSrc1Val = pVStack_40;
      bVar2 = TypeSpecializeFloatUnary(this,pInstr,pVStack_40,pDstVal,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2d,"(retVal)",
                           "For inline built-ins the args have to be type-specialized (float), but something failed during the process."
                          );
        if (!bVar2) goto LAB_0045d31a;
        *puVar5 = 0;
      }
      pIVar9 = *pInstr;
      pVVar7 = *pSrc1Val;
LAB_0045d1c0:
      TypeSpecializeFloatDst(this,pIVar9,(Value *)0x0,pVVar7,(Value *)0x0,pDstVal);
      return;
    }
    if ((*(uint *)&this->field_0xf4 >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e12,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    bVar2 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val,pDstVal,local_34[0],local_44,pVStack_40,redoTypeSpecRef,
                       true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e14,"(retVal)",
                         "For inline built-ins the args have to be type-specialized (int), but something failed during the process."
                        );
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    uVar8 = 0x80000001;
    if (-0x7fffffff < (int)local_34[0]) {
      uVar8 = local_34[0];
    }
    uVar10 = -uVar8;
    if (0 < (int)uVar8) {
      uVar10 = uVar8;
    }
    uVar8 = 0x80000001;
    if (-0x7fffffff < (int)local_44) {
      uVar8 = local_44;
    }
    local_44 = -uVar8;
    if (0 < (int)uVar8) {
      local_44 = uVar8;
    }
    if (local_44 < uVar10) {
      local_44 = uVar10;
    }
    if ((int)local_34[0] < 1) {
      local_34[0] = 0;
    }
    pIVar9 = *pInstr;
    originalOpCode = pIVar9->m_opcode;
    pVVar7 = *pSrc1Val;
    uVar8 = local_44;
    uVar10 = local_34[0];
LAB_0045d2b1:
    TypeSpecializeIntDst
              (this,pIVar9,originalOpCode,(Value *)0x0,pVVar7,(Value *)0x0,BailOutInvalid,uVar10,
               uVar8,pDstVal,(AddSubConstantInfo *)0x0);
    return;
  case InlineMathClz:
    uVar8 = *(uint *)&this->field_0xf4;
    if ((uVar8 >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6d,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
      uVar8 = *(uint *)&this->field_0xf4;
    }
    if ((uVar8 >> 0xc & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6e,"(this->DoLossyIntTypeSpec())","this->DoLossyIntTypeSpec()");
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    bVar2 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val,pDstVal,-0x80000000,0x7fffffff,pVStack_40,
                       redoTypeSpecRef,false);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(retVal)";
    message = "For clz32, the arg has to be type-specialized to int.";
    lineNumber = 0x1e71;
    break;
  case InlineMathCeil:
  case InlineMathFloor:
  case InlineMathRound:
    *pSrc1Val = pVStack_40;
    bVar2 = TypeSpecializeFloatUnary(this,pInstr,pVStack_40,pDstVal,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e37,"(retVal)",
                         "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) goto LAB_0045d31a;
      *puVar5 = 0;
    }
    TypeSpecializeIntDst
              (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,*pSrc1Val,(Value *)0x0,BailOutInvalid,
               -0x80000000,0x7fffffff,pDstVal,(AddSubConstantInfo *)0x0);
    return;
  default:
    if (pIVar9->m_opcode == InlineArrayPop) {
      opnd = pIVar9->m_src1;
      if (opnd == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        pVStack_40 = (Value *)pDstVal;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e49,"(thisOpnd)","thisOpnd");
        if (!bVar2) goto LAB_0045d31a;
        *puVar5 = 0;
        ToVarUses(this,*pInstr,(Opnd *)0x0,false,*pSrc1Val);
        pDstVal = (Value **)pVStack_40;
      }
      else {
        ToVarUses(this,pIVar9,opnd,false,*pSrc1Val);
      }
      if (this->prePassLoop == (Loop *)0x0) {
        local_4a = (opnd->m_valueType).field_0;
        bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
        if (bVar2) {
          GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
        }
      }
      if ((*pInstr)->m_dst == (Opnd *)0x0) {
        return;
      }
      local_48 = (opnd->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_48.field_0);
      if (!bVar2) {
        local_46 = (opnd->m_valueType).field_0;
        bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_46.field_0);
        pIVar9 = *pInstr;
        if (!bVar2) {
          OVar3 = IR::Opnd::GetKind(pIVar9->m_dst);
          if (OVar3 != OpndKindReg) {
            return;
          }
          this_00 = (GlobOpt *)(*pInstr)->m_dst;
          pRVar6 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
          ToVarStackSym(this_00,pRVar6->m_sym,this->currentBlock);
          return;
        }
        pVVar7 = (Value *)0x0;
        goto LAB_0045d1c0;
      }
      pIVar9 = *pInstr;
      originalOpCode = pIVar9->m_opcode;
      pVVar7 = (Value *)0x0;
      uVar8 = 0x7fffffff;
      uVar10 = 0x80000000;
      goto LAB_0045d2b1;
    }
  case Ctz:
  case Clz:
  case InlineMathMax:
  case InlineMathImul:
  case InlineMathMin:
  case InlineMathRandom:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(0)";
    message = "Unsupported built-in!";
    lineNumber = 0x1e75;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar5 = 0;
    return;
  }
LAB_0045d31a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
GlobOpt::TypeSpecializeInlineBuiltInUnary(IR::Instr **pInstr, Value **pSrc1Val, Value **pDstVal, Value *const src1OriginalVal, bool *redoTypeSpecRef)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    Assert(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInInlineCandidateId(instr->m_opcode);   // From actual instr, not profile based.
    Assert(builtInId != Js::BuiltinFunction::None);

    // Consider using different bailout for float/int FromVars, so that when the arg cannot be converted to number we don't disable
    //       type spec for other parts of the big function but rather just don't inline that built-in instr.
    //       E.g. could do that if the value is not likelyInt/likelyFloat.

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    bool areAllArgsAlwaysFloat = (builtInFlags & Js::BuiltInFlags::BIF_Args) == Js::BuiltInFlags::BIF_TypeSpecUnaryToFloat;
    if (areAllArgsAlwaysFloat)
    {
        // InlineMathAcos, InlineMathAsin, InlineMathAtan, InlineMathCos, InlineMathExp, InlineMathLog, InlineMathSin, InlineMathSqrt, InlineMathTan.
        Assert(this->DoFloatTypeSpec());

        // Type-spec the src.
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline built-ins the args have to be type-specialized to float, but something failed during the process.");

        // Type-spec the dst.
        this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathAbs)
    {
        // Consider the case when the value is unknown - because of bailout in abs we may disable type spec for the whole function which is too much.
        // First, try int.
        int minVal, maxVal;
        bool shouldTypeSpecToInt = src1Val->GetValueInfo()->GetIntValMinMax(&minVal, &maxVal, /* doAggressiveIntTypeSpec = */ true);
        if (shouldTypeSpecToInt)
        {
            Assert(this->DoAggressiveIntTypeSpec());
            bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, minVal, maxVal, src1OriginalVal, redoTypeSpecRef, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (int), but something failed during the process.");

            if (!this->IsLoopPrePass())
            {
                // Create bailout for INT_MIN which does not have corresponding int value on the positive side.
                // Check int range: if we know the range is out of overflow, we do not need the bail out at all.
                if (minVal == INT32_MIN)
                {
                    GenerateBailAtOperation(&instr, IR::BailOnIntMin);
                }
            }

            // Account for ::abs(INT_MIN) == INT_MIN (which is less than 0).
            maxVal = ::max(
                ::abs(Int32Math::NearestInRangeTo(minVal, INT_MIN + 1, INT_MAX)),
                ::abs(Int32Math::NearestInRangeTo(maxVal, INT_MIN + 1, INT_MAX)));
            minVal = minVal >= 0 ? minVal : 0;
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, nullptr, IR::BailOutInvalid, minVal, maxVal, pDstVal);
        }
        else
        {
            // If we couldn't do int, do float.
            Assert(this->DoFloatTypeSpec());
            src1Val = src1OriginalVal;
            bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (float), but something failed during the process.");

            this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathFloor || instr->m_opcode == Js::OpCode::InlineMathCeil || instr->m_opcode == Js::OpCode::InlineMathRound)
    {
        // Type specialize src to float
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process.");

        // Type specialize dst to int
        this->TypeSpecializeIntDst(
            instr,
            instr->m_opcode,
            nullptr,
            src1Val,
            nullptr,
            IR::BailOutInvalid,
            INT32_MIN,
            INT32_MAX,
            pDstVal);
    }
    else if(instr->m_opcode == Js::OpCode::InlineArrayPop)
    {
        IR::Opnd *const thisOpnd = instr->GetSrc1();

        Assert(thisOpnd);

        // Ensure src1 (Array) is a var
        this->ToVarUses(instr, thisOpnd, false, src1Val);

        if(!this->IsLoopPrePass() && thisOpnd->GetValueType().IsLikelyNativeArray())
        {
            // We bail out, if there is illegal access or a mismatch in the Native array type that is optimized for, during the run time.
            GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
        }

        if(!instr->GetDst())
        {
            return;
        }

        // Try Type Specializing the element (return item from Pop) based on the array's profile data.
        if(thisOpnd->GetValueType().IsLikelyNativeIntArray())
        {
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, IR::BailOutInvalid, INT32_MIN, INT32_MAX, pDstVal);
        }
        else if(thisOpnd->GetValueType().IsLikelyNativeFloatArray())
        {
            this->TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, pDstVal);
        }
        else
        {
            // We reached here so the Element is not yet type specialized. Ensure element is a var
            if(instr->GetDst()->IsRegOpnd())
            {
                this->ToVarRegOpnd(instr->GetDst()->AsRegOpnd(), currentBlock);
            }
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathClz)
    {
        Assert(this->DoAggressiveIntTypeSpec());
        Assert(this->DoLossyIntTypeSpec());
        //Type specialize to int
        bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, INT32_MIN, INT32_MAX, src1OriginalVal, redoTypeSpecRef);
        AssertMsg(retVal, "For clz32, the arg has to be type-specialized to int.");
    }
    else
    {
        AssertMsg(FALSE, "Unsupported built-in!");
    }
}